

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_text_wrap_colored(nk_context *ctx,char *str,int len,nk_color color)

{
  nk_vec2 nVar1;
  nk_window *pnVar2;
  nk_user_font *font;
  int len_00;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  nk_rect b;
  int local_b0;
  float width;
  float local_a8;
  float fStack_a4;
  undefined8 uStack_a0;
  nk_color local_98;
  float fStack_94;
  float fStack_90;
  undefined4 uStack_8c;
  nk_rect local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  nk_text local_50;
  nk_rect bounds;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4bb4,
                  "void nk_text_wrap_colored(struct nk_context *, const char *, int, struct nk_color)"
                 );
  }
  pnVar2 = ctx->current;
  if (pnVar2 != (nk_window *)0x0) {
    local_98 = color;
    if (pnVar2->layout != (nk_panel *)0x0) {
      nk_panel_alloc_space(&bounds,ctx);
      local_50.background = (ctx->style).window.background;
      font = (ctx->style).font;
      local_88.x = bounds.x;
      local_88.y = bounds.y;
      local_88.w = 0.0;
      local_88.h = 0.0;
      local_50.padding.x = 0.0;
      local_50.padding.y = 0.0;
      local_50.text = local_98;
      nVar1 = (ctx->style).text.padding;
      fVar4 = nVar1.x;
      fStack_74 = nVar1.y;
      fVar5 = fVar4 + fVar4;
      if (fVar4 + fVar4 <= bounds.w) {
        fVar5 = bounds.w;
      }
      fVar6 = fStack_74 + fStack_74;
      local_78 = fVar6;
      if (fVar6 <= bounds.h) {
        local_78 = bounds.h;
      }
      local_78 = local_78 - fVar6;
      local_a8 = fVar4 + bounds.x;
      fStack_a4 = fStack_74 + bounds.y;
      uStack_a0 = 0;
      local_98 = (nk_color)(fVar4 * -2.0 + fVar5);
      fStack_94 = fStack_74 * 2.0 + font->height;
      fStack_90 = fStack_74 + 0.0;
      uStack_8c = 0;
      fStack_70 = fStack_74;
      fStack_6c = fStack_74;
      local_68 = fStack_74;
      fStack_64 = fStack_74;
      fStack_60 = fStack_74;
      fStack_5c = fStack_74;
      len_00 = nk_text_clamp(font,str,len,(float)local_98,&local_b0,&width,
                             &nk_widget_text_wrap_seperator,1);
      local_88.x = local_88.y + local_78;
      local_88.h = local_88.y;
      local_88.w = local_88.y;
      iVar3 = 0;
      while (((iVar3 < len && (len_00 != 0)) && (fStack_94 + fStack_a4 < local_88.x))) {
        b.h = fStack_94;
        b.w = (float)local_98;
        b.y = fStack_a4;
        b.x = local_a8;
        local_78 = fStack_a4;
        fStack_74 = fStack_a4;
        fStack_70 = fStack_a4;
        fStack_6c = fStack_a4;
        nk_widget_text(&pnVar2->buffer,b,str + iVar3,len_00,&local_50,0x11,font);
        iVar3 = iVar3 + len_00;
        fStack_a4 = local_68 + local_68 + font->height + local_78;
        len_00 = nk_text_clamp(font,str + iVar3,len - iVar3,(float)local_98,&local_b0,&width,
                               &nk_widget_text_wrap_seperator,1);
      }
      return;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4bb6,
                  "void nk_text_wrap_colored(struct nk_context *, const char *, int, struct nk_color)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x4bb5,
                "void nk_text_wrap_colored(struct nk_context *, const char *, int, struct nk_color)"
               );
}

Assistant:

NK_API void
nk_text_wrap_colored(struct nk_context *ctx, const char *str,
    int len, struct nk_color color)
{
    struct nk_window *win;
    const struct nk_style *style;

    struct nk_vec2 item_padding;
    struct nk_rect bounds;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout) return;

    win = ctx->current;
    style = &ctx->style;
    nk_panel_alloc_space(&bounds, ctx);
    item_padding = style->text.padding;

    text.padding.x = item_padding.x;
    text.padding.y = item_padding.y;
    text.background = style->window.background;
    text.text = color;
    nk_widget_text_wrap(&win->buffer, bounds, str, len, &text, style->font);
}